

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

bool decompressHigu(vector<unsigned_char,_std::allocator<unsigned_char>_> *output,uint8_t *input,
                   int inputLength,bool isSwitch)

{
  size_type sVar1;
  byte in_CL;
  int in_EDX;
  int iVar2;
  long in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  ptrdiff_t index;
  int i;
  int offset;
  int count;
  uint8_t b2;
  uint8_t b1;
  int p;
  int marker;
  int in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  byte in_stack_ffffffffffffffd6;
  byte in_stack_ffffffffffffffd7;
  int local_28;
  uint local_24;
  
  local_24 = 1;
  local_28 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x108d14);
  while( true ) {
    if (in_EDX <= local_28) {
      return true;
    }
    if (local_24 == 1) {
      local_24 = *(byte *)(in_RSI + local_28) | 0x100;
      local_28 = local_28 + 1;
    }
    if (in_EDX <= local_28) break;
    if ((local_24 & 1) == 0) {
      local_28 = local_28 + 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_ffffffffffffffd7,
                          CONCAT16(in_stack_ffffffffffffffd6,
                                   CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))),
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    else {
      if (in_EDX < local_28 + 2) {
        return false;
      }
      iVar2 = local_28 + 1;
      in_stack_ffffffffffffffd7 = *(byte *)(in_RSI + local_28);
      local_28 = local_28 + 2;
      in_stack_ffffffffffffffd6 = *(byte *)(in_RSI + iVar2);
      if ((in_CL & 1) != 0) {
        in_stack_ffffffffffffffd7 =
             (byte)((int)(uint)in_stack_ffffffffffffffd7 >> 4) | in_stack_ffffffffffffffd7 << 4;
      }
      in_stack_ffffffffffffffd0 = (in_stack_ffffffffffffffd7 & 0xf) + 3;
      in_stack_ffffffffffffffcc =
           (in_stack_ffffffffffffffd7 & 0xf0) << 4 | (uint)in_stack_ffffffffffffffd6;
      for (in_stack_ffffffffffffffc8 = 0; in_stack_ffffffffffffffc8 < in_stack_ffffffffffffffd0;
          in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + 1) {
        sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
        sVar1 = sVar1 - (long)(int)(in_stack_ffffffffffffffcc + 1);
        if ((long)sVar1 < 0) {
          return false;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RDI,sVar1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_ffffffffffffffd7,
                            CONCAT16(in_stack_ffffffffffffffd6,
                                     CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)))
                   ,(value_type_conflict1 *)
                    CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
    }
    local_24 = (int)local_24 >> 1;
  }
  return true;
}

Assistant:

bool decompressHigu(std::vector<uint8_t> &output, const uint8_t *input, int inputLength, bool isSwitch) {
	int marker = 1;
	int p = 0;

	output.clear();

	while (p < inputLength) {
		if (marker == 1) {
			marker = 0x100 | input[p++];
		}

		if (p >= inputLength) {
			break;
		}

		if (marker & 1) {
			if (p + 2 > inputLength) {
				return false;
			}
			uint8_t b1 = input[p++];
			uint8_t b2 = input[p++];

			if (isSwitch) {
				b1 = (b1 >> 4) | (b1 << 4);
			}

			int count = (b1 & 0x0F) + 3;
			int offset = ((b1 & 0xF0) << 4) | b2;

			for (int i = 0; i < count; i++) {
				ptrdiff_t index = output.size() - (offset + 1);
				if (index < 0) {
					return false;
				}
				output.push_back(output[index]);
			}
		}
		else {
			output.push_back(input[p++]);
		}

		marker >>= 1;
	}
	return true;
}